

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O3

void decusecount68k(FX *frame68k)

{
  DLword *pDVar1;
  ushort *puVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  FX *frame68k_00;
  uint uVar7;
  
  if ((FX *)Stackspace != frame68k && frame68k != (FX *)0x0) {
    while( true ) {
      uVar6 = (long)frame68k - (long)Stackspace;
      if (0xffff < (ulong)((long)uVar6 >> 1)) {
        printf("Stack offset is out of range: 0x%tx\n");
      }
      if ((uVar6 & 0x1fffe) == 0) {
        return;
      }
      uVar3 = *(ushort *)&frame68k->field_0x2;
      if ((char)uVar3 != '\0') break;
      frame68k_00 = (FX *)((ulong)(((*(uint *)frame68k & 0xfffffffe) - 10 & 0xffff) * 2) +
                          (long)Stackspace);
      if ((frame68k->alink & 1) == 0) {
        pDVar1 = &frame68k[-1].clink;
        if (((ulong)pDVar1 & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",pDVar1);
        }
        uVar7 = (uint)((int)pDVar1 - (int)Lisp_world) >> 1;
      }
      else {
        uVar7 = (uint)frame68k->blink;
      }
      if ((uVar7 & 1) != 0) {
        printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",
               (ulong)(uVar7 & 0xffff));
      }
      pDVar1 = Stackspace;
      iVar4 = *(int *)((long)&frame68k->alink + (ulong)((*(uint *)frame68k & 1) << 4));
      uVar3 = frame68k->nextblock;
      if (((ulong)frame68k & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",frame68k);
      }
      uVar5 = (uint)uVar3 - ((uint)((int)frame68k - (int)Lisp_world) >> 1 & 0xffff);
      if ((frame68k[-1].blink & 0x200) == 0) {
        if ((int)uVar5 < 1) {
          error("creating 0 length free stack block");
        }
        if ((uVar5 & 1) != 0) {
          error("creating odd length free stack block");
        }
      }
      else {
        if ((int)uVar5 < -1) {
          error("creating 0 length free stack block");
        }
        if ((uVar5 & 1) != 0) {
          error("creating odd length free stack block");
        }
        frame68k = (FX *)&frame68k[-1].clink;
        uVar5 = uVar5 + 2;
      }
      puVar2 = pDVar1 + (uVar7 & 0xffff);
      *(uint *)frame68k = uVar5 & 0xffff | 0xa0000000;
      uVar3 = puVar2[1];
      if ((char)uVar3 == '\0') {
        uVar6 = (long)puVar2 - (long)Stackspace >> 1;
        if (0xffff < uVar6) {
          printf("Stack offset is out of range: 0x%tx\n",uVar6);
        }
        if ((int)(((uint)uVar6 & 0xffff) - (uint)*puVar2) < -1) {
          error("creating 0 length free stack block");
        }
        uVar6 = (long)puVar2 - (long)Stackspace >> 1;
        if (0xffff < uVar6) {
          printf("Stack offset is out of range: 0x%tx\n",uVar6);
        }
        if (((int)uVar6 - (uint)*puVar2 & 1) != 0) {
          error("creating odd length free stack block");
        }
        uVar6 = (long)puVar2 - (long)Stackspace >> 1;
        if (0xffff < uVar6) {
          printf("Stack offset is out of range: 0x%tx\n",uVar6);
        }
        *(uint *)(Stackspace + *puVar2) = ((int)uVar6 - (uint)*puVar2) + 2 & 0xffff | 0xa0000000;
      }
      else {
        puVar2[1] = uVar3 & 0xff00 | uVar3 - 1 & 0xff;
      }
      frame68k = (FX *)(pDVar1 + (iVar4 - 10U & 0xffff));
      if (frame68k_00 != frame68k) {
        decusecount68k(frame68k_00);
      }
    }
    *(ushort *)&frame68k->field_0x2 = uVar3 & 0xff00 | uVar3 - 1 & 0xff;
  }
  return;
}

Assistant:

void decusecount68k(FX *frame68k) {
  DLword *alink68k;
  Bframe *blink68k;
  DLword *clink68k;
  /*** DLword *ivar68k; */
  int size;

  if (FX_INVALIDP(frame68k)) return;
  CHECK_FX(frame68k);
  /* I don't check if \INTERRUPTABLE is NIL */
  while (StackOffsetFromNative(frame68k)) {
    if (frame68k->usecount != 0) {
      frame68k->usecount--;
      return;
    } else {
      alink68k = NativeAligned2FromStackOffset(GETALINK(frame68k));
      blink68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(frame68k));
      clink68k = NativeAligned2FromStackOffset(GETCLINK(frame68k));

      size = FX_size(frame68k);

      if (((Bframe *)DUMMYBF(frame68k))->residual) { /* this frame has dummy BF */
        MAKEFREEBLOCK(((DLword *)frame68k) - DLWORDSPER_CELL, size + DLWORDSPER_CELL);
      } else {
        MAKEFREEBLOCK(frame68k, size);
      }

      if (blink68k->usecnt != 0) {
        blink68k->usecnt--;
      } else {
        /***    ivar68k=NativeAligned2FromStackOffset(blink68k->ivar);
            GETWORD(ivar68k)=STK_FSB_WORD;
            GETWORD(ivar68k+1)=ivar68k -(DLword *)blink68k +2; **/

        MAKEFREEBLOCK(NativeAligned2FromStackOffset(blink68k->ivar), BF_size(blink68k));
      }
      if (alink68k != clink68k) decusecount68k((FX *)alink68k);

      frame68k = (FX *)clink68k;

    } /* else end */

  } /*while end */
}